

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O1

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  char cVar1;
  byte bVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  x86_reg xVar6;
  uint uVar7;
  MCOperand *pMVar8;
  int64_t iVar9;
  MCRegisterClass *c;
  long lVar10;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *extraout_RDX_03;
  SStream *extraout_RDX_04;
  SStream *pSVar11;
  char *pcVar12;
  uint8_t uVar13;
  uint uVar14;
  int reg_00;
  x86_avx_bcast v;
  uint8_t *puVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  x86_reg reg;
  x86_reg reg2;
  x86_reg local_38;
  x86_reg local_34;
  
  uVar5 = MCInst_getOpcode(MI);
  pcVar12 = (char *)0x0;
  if ((int)uVar5 < 0x269) {
    if (uVar5 == 0x15) {
      uVar5 = MCInst_getNumOperands(MI);
      if (uVar5 == 1) {
        pcVar12 = (char *)0x0;
        pMVar8 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar8);
        if (_Var4) {
          pcVar12 = (char *)0x0;
          pMVar8 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar8);
          if (iVar9 == 10) {
            pcVar12 = "aad";
            goto LAB_001a8d91;
          }
        }
      }
      else {
LAB_001a8db3:
        pcVar12 = (char *)0x0;
      }
    }
    else {
      pcVar12 = (char *)0x0;
      if (uVar5 == 0x16) {
        uVar5 = MCInst_getNumOperands(MI);
        if (uVar5 != 1) goto LAB_001a8db3;
        pcVar12 = (char *)0x0;
        pMVar8 = MCInst_getOperand(MI,0);
        _Var4 = MCOperand_isImm(pMVar8);
        if (_Var4) {
          pcVar12 = (char *)0x0;
          pMVar8 = MCInst_getOperand(MI,0);
          iVar9 = MCOperand_getImm(pMVar8);
          if (iVar9 == 10) {
            pcVar12 = "aam";
            goto LAB_001a8d91;
          }
        }
      }
    }
  }
  else if (uVar5 == 0x269) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 != 6) goto LAB_001a8db3;
    pcVar12 = (char *)0x0;
    pMVar8 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isReg(pMVar8);
    if (_Var4) {
      c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
      pcVar12 = (char *)0x0;
      pMVar8 = MCInst_getOperand(MI,0);
      uVar5 = MCOperand_getReg(pMVar8);
      _Var4 = MCRegisterClass_contains(c,uVar5);
      if (_Var4) {
        pcVar12 = anon_var_dwarf_ec9d5;
        goto LAB_001a8d91;
      }
    }
  }
  else if (uVar5 == 0x1879) {
    uVar5 = MCInst_getNumOperands(MI);
    if (uVar5 != 0) goto LAB_001a8db3;
    pcVar12 = "xstorerng";
LAB_001a8d91:
    pcVar12 = cs_strdup(pcVar12);
    for (pcVar16 = pcVar12; cVar1 = *pcVar16, cVar1 != '\0'; pcVar16 = pcVar16 + 1) {
      if ((cVar1 == ' ') || (cVar1 == '\t')) {
        *pcVar16 = '\0';
        pcVar16 = pcVar16 + 1;
        break;
      }
    }
    SStream_concat0(O,pcVar12);
    if (*pcVar16 != '\0') {
      SStream_concat0(O,anon_var_dwarf_761f8 + 0x11);
      do {
        cVar1 = *pcVar16;
        if (cVar1 == '$') {
          if (pcVar16[1] == -1) {
            pcVar17 = pcVar16 + 3;
            if (pcVar16[3] == '\x01') {
              cVar1 = pcVar16[2];
              SStream_concat0(O,"qword ptr ");
              MI->x86opsize = '\b';
              printMemReference(MI,(int)cVar1 - 1,O);
            }
          }
          else {
            pcVar17 = pcVar16 + 1;
            printOperand(MI,(int)pcVar16[1] - 1,O);
          }
        }
        else {
          if (cVar1 == '\0') break;
          SStream_concat(O,"%c",(ulong)(uint)(int)cVar1);
          pcVar17 = pcVar16;
        }
        pcVar16 = pcVar17 + 1;
      } while( true );
    }
  }
  if (pcVar12 != (char *)0x0) {
    (*cs_mem_free)(pcVar12);
    goto switchD_001a8fb9_default;
  }
  uVar7 = MCInst_getOpcode(MI);
  uVar5 = *(uint *)(printInstruction_OpInfo + (ulong)uVar7 * 4);
  uVar7 = *(uint *)(printInstruction_OpInfo2 + (ulong)uVar7 * 4);
  _Var4 = X86_lockrep(MI,O);
  if (!_Var4) {
    SStream_concat0(O,(char *)((ulong)(uVar5 & 0x3fff) + 0x33705f));
  }
  switch(uVar5 >> 0xe & 0x3f) {
  case 1:
    uVar14 = 0;
    goto LAB_001a92eb;
  case 2:
    MI->x86opsize = '\x02';
    pcVar12 = "word ptr ";
    goto LAB_001a930c;
  case 3:
    uVar14 = 1;
LAB_001a92eb:
    printOperand(MI,uVar14,O);
    goto LAB_001a95be;
  case 4:
    MI->x86opsize = '\x04';
    pcVar12 = "dword ptr ";
LAB_001a930c:
    SStream_concat0(O,pcVar12);
    break;
  case 5:
  case 8:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    break;
  case 6:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    break;
  case 7:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    break;
  case 9:
    pMVar8 = MCInst_getOperand(MI,0);
    _Var4 = MCOperand_isImm(pMVar8);
    if (_Var4) {
      iVar9 = MCOperand_getImm(pMVar8);
      lVar18 = (ulong)MI->flat_insn->size + iVar9 + MI->address;
      if (lVar18 < 0) {
LAB_001a949c:
        pcVar12 = " + 0x%lx";
      }
      else {
        lVar10 = lVar18 + -0x10000;
        if (MI->csh->mode != CS_MODE_16) {
          lVar10 = lVar18;
        }
        if (0x100000 < lVar18) {
          lVar18 = lVar10;
        }
        if (9 < lVar18) goto LAB_001a949c;
        pcVar12 = " + %lu";
      }
      SStream_concat(O,pcVar12 + 3,lVar18);
      if (MI->csh->detail != CS_OPT_OFF) {
        pcVar3 = MI->flat_insn->detail;
        puVar15 = pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x3e;
        puVar15[0] = '\x02';
        puVar15[1] = '\0';
        puVar15[2] = '\0';
        puVar15[3] = '\0';
        pcVar3 = MI->flat_insn->detail;
        bVar2 = (pcVar3->field_6).x86.op_count;
        puVar15 = (uint8_t *)((long)&pcVar3->field_6 + 0x50);
        if (bVar2 == 0) {
          puVar15 = &MI->imm_size;
        }
        pcVar3->groups[(ulong)((uint)bVar2 * 0x30) + 0x5e] = *puVar15;
        pcVar3 = MI->flat_insn->detail;
        *(long *)(pcVar3->groups + (ulong)((uint)(pcVar3->field_6).x86.op_count * 0x30) + 0x46) =
             lVar18;
        puVar15 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar15 = *puVar15 + '\x01';
      }
      if (MI->op1_size == '\0') {
        MI->op1_size = MI->imm_size;
      }
    }
    goto LAB_001a95be;
  case 10:
    uVar14 = 7;
    goto LAB_001a9420;
  case 0xb:
    uVar14 = 3;
LAB_001a9420:
    printSSECC(MI,uVar14,O);
    goto LAB_001a95be;
  case 0xc:
    pcVar12 = "byte ptr ";
    SStream_concat0(O,"byte ptr ");
    uVar13 = '\x01';
    goto LAB_001a937d;
  case 0xd:
    pcVar12 = "dword ptr ";
    SStream_concat0(O,"dword ptr ");
    uVar13 = '\x04';
    goto LAB_001a937d;
  case 0xe:
    pcVar12 = "qword ptr ";
    SStream_concat0(O,"qword ptr ");
    uVar13 = '\b';
    goto LAB_001a937d;
  case 0xf:
    pcVar12 = "word ptr ";
    SStream_concat0(O,"word ptr ");
    uVar13 = '\x02';
LAB_001a937d:
    MI->x86opsize = uVar13;
    printSrcIdx(MI,1,O);
    SStream_concat0(O,", ");
    SStream_concat0(O,pcVar12);
    MI->x86opsize = uVar13;
    printDstIdx(MI,0,O);
    goto switchD_001a8fb9_default;
  case 0x10:
  case 0x24:
    SStream_concat0(O,"xmmword ptr ");
    MI->x86opsize = '\x10';
    break;
  case 0x11:
    uVar5 = 0;
    goto LAB_001a9a26;
  case 0x12:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    goto LAB_001a95b4;
  case 0x13:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    goto LAB_001a95b4;
  case 0x14:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    goto LAB_001a95b4;
  case 0x15:
    uVar14 = 7;
    goto LAB_001a9526;
  case 0x16:
    uVar14 = 3;
LAB_001a9526:
    printAVXCC(MI,uVar14,O);
    goto LAB_001a95be;
  case 0x17:
    SStream_concat0(O,"xword ptr ");
    MI->x86opsize = '\n';
    uVar5 = 0;
    goto LAB_001a9c4a;
  case 0x18:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    goto LAB_001a987b;
  case 0x19:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    goto LAB_001a987b;
  case 0x1a:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a987b;
  case 0x1b:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
LAB_001a987b:
    printSrcIdx(MI,0,O);
    goto switchD_001a8fb9_default;
  case 0x1c:
    MI->x86opsize = '\x02';
    pcVar12 = "word ptr ";
    goto LAB_001a982c;
  case 0x1d:
    MI->x86opsize = '\x04';
    pcVar12 = "dword ptr ";
LAB_001a982c:
    SStream_concat0(O,pcVar12);
    goto LAB_001a9834;
  case 0x1e:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a9834;
  case 0x1f:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
LAB_001a9834:
    printMemReference(MI,2,O);
LAB_001a9844:
    SStream_concat0(O,", ");
    uVar5 = 1;
    goto LAB_001a9b00;
  case 0x20:
    SStream_concat0(O,"word ptr ");
    MI->x86opsize = '\x02';
    pSVar11 = extraout_RDX_02;
    goto LAB_001a950f;
  case 0x21:
    SStream_concat0(O,"dword ptr ");
    MI->x86opsize = '\x04';
    pSVar11 = extraout_RDX_01;
    goto LAB_001a950f;
  case 0x22:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    pSVar11 = extraout_RDX_00;
    goto LAB_001a950f;
  case 0x23:
    SStream_concat0(O,"byte ptr ");
    MI->x86opsize = '\x01';
    pSVar11 = extraout_RDX;
LAB_001a950f:
    printMemOffset(MI,(uint)O,pSVar11);
    goto LAB_001a95be;
  case 0x25:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
LAB_001a95b4:
    printDstIdx(MI,0,O);
    goto LAB_001a95be;
  case 0x26:
  case 0x27:
    SStream_concat0(O,"ymmword ptr ");
    MI->x86opsize = ' ';
    break;
  case 0x28:
  case 0x29:
    SStream_concat0(O,"zmmword ptr ");
    MI->x86opsize = '@';
    break;
  case 0x2a:
    MI->x86opsize = '\x04';
    SStream_concat0(O,"dword ptr ");
    goto LAB_001a954e;
  case 0x2b:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
LAB_001a954e:
    printMemReference(MI,1,O);
    SStream_concat0(O," {");
    printOperand(MI,6,O);
    SStream_concat0(O,"}, ");
    goto LAB_001a958f;
  case 0x2c:
    printOperand(MI,2,O);
    goto LAB_001a9844;
  default:
    goto switchD_001a8fb9_default;
  }
  printMemReference(MI,0,O);
LAB_001a95be:
  pcVar12 = ", ";
  switch(uVar5 >> 0x14 & 0x1f) {
  case 1:
    break;
  case 2:
    SStream_concat0(O,", st(0)");
    reg_00 = 0x6a;
    goto LAB_001a9b81;
  case 3:
    pcVar12 = "pd\t";
    goto LAB_001a96fa;
  case 4:
    pcVar12 = "ps\t";
    goto LAB_001a96fa;
  case 5:
    pcVar12 = "sd\t";
    goto LAB_001a96fa;
  case 6:
    pcVar12 = "ss\t";
LAB_001a96fa:
    SStream_concat0(O,pcVar12);
    uVar14 = 0;
    goto LAB_001a9797;
  case 7:
    SStream_concat0(O,":");
    goto LAB_001a9ac3;
  case 8:
    SStream_concat0(O,", dx");
    reg_00 = 0x12;
    goto LAB_001a9b81;
  case 9:
    SStream_concat0(O,", ax");
    reg_00 = 3;
    goto LAB_001a9b81;
  case 10:
    SStream_concat0(O,", eax");
    reg_00 = 0x13;
    goto LAB_001a9b81;
  case 0xb:
    SStream_concat0(O,", rax");
    reg_00 = 0x23;
    goto LAB_001a9b81;
  case 0xc:
    SStream_concat0(O,", al");
    reg_00 = 2;
    goto LAB_001a9b81;
  case 0xd:
    goto switchD_001a95e9_caseD_d;
  case 0xe:
    SStream_concat0(O,", 1");
    op_addImm(MI,1);
  default:
    goto switchD_001a8fb9_default;
  case 0x10:
    pcVar12 = " {";
    break;
  case 0x11:
    pcVar12 = "pd \t";
    goto LAB_001a9763;
  case 0x12:
    pcVar12 = "ps \t";
    goto LAB_001a9763;
  case 0x13:
    pcVar12 = "}, ";
    break;
  case 0x14:
    pcVar12 = "d\t";
    goto LAB_001a9763;
  case 0x15:
    pcVar12 = "q\t";
    goto LAB_001a9763;
  case 0x16:
    pcVar12 = "ud\t";
    goto LAB_001a9763;
  case 0x17:
    pcVar12 = "uq\t";
LAB_001a9763:
    SStream_concat0(O,pcVar12);
    printOperand(MI,0,O);
    SStream_concat0(O,", ");
    uVar14 = 1;
LAB_001a9797:
    pcVar12 = ", ";
    printOperand(MI,uVar14,O);
  }
  SStream_concat0(O,pcVar12);
  switch(uVar5 >> 0x19 & 0x3f) {
  case 1:
    uVar14 = 2;
    goto LAB_001a9b29;
  case 2:
    uVar14 = 2;
    goto LAB_001a99fc;
  case 3:
    uVar14 = 2;
    goto LAB_001a9a50;
  case 4:
    uVar14 = 2;
    goto LAB_001a9a3b;
  case 5:
    uVar14 = 2;
    goto LAB_001a98d0;
  case 6:
    uVar14 = 2;
    goto LAB_001a99d2;
  case 7:
    printf64mem(MI,2,O);
    break;
  case 8:
    printf32mem(MI,2,O);
    break;
  case 9:
    uVar14 = 1;
LAB_001a9a50:
    printi32mem(MI,uVar14,O);
    break;
  case 10:
    uVar14 = 1;
    goto LAB_001a9b29;
  case 0xb:
    uVar14 = 1;
LAB_001a9a3b:
    printi64mem(MI,uVar14,O);
    break;
  case 0xc:
    uVar14 = 2;
    goto LAB_001a98e5;
  case 0xd:
    uVar14 = 1;
LAB_001a98e5:
    printi128mem(MI,uVar14,O);
    break;
  case 0xe:
    uVar14 = 1;
LAB_001a99fc:
    printi16mem(MI,uVar14,O);
    break;
  case 0xf:
    uVar14 = 1;
LAB_001a98d0:
    printi8mem(MI,uVar14,O);
    break;
  case 0x10:
    uVar14 = 1;
LAB_001a99d2:
    printf128mem(MI,uVar14,O);
    break;
  case 0x11:
    printf64mem(MI,1,O);
    goto switchD_001a8fb9_default;
  case 0x12:
    printf32mem(MI,1,O);
    goto switchD_001a8fb9_default;
  case 0x13:
    uVar5 = 1;
LAB_001a9a26:
    printopaquemem(MI,uVar5,O);
    goto switchD_001a8fb9_default;
  case 0x14:
    printSrcIdx8(MI,1,O);
    goto switchD_001a8fb9_default;
  case 0x15:
    printSrcIdx32(MI,1,O);
    goto switchD_001a8fb9_default;
  case 0x16:
    printSrcIdx64(MI,1,O);
    goto switchD_001a8fb9_default;
  case 0x17:
    printSrcIdx16(MI,1,O);
    goto switchD_001a8fb9_default;
  case 0x18:
LAB_001a9ac3:
    uVar5 = 0;
    goto LAB_001a9b00;
  case 0x19:
    printi256mem(MI,1,O);
    break;
  case 0x1a:
    printf512mem(MI,2,O);
    SStream_concat0(O,", ");
    printAVXCC(MI,7,O);
    goto switchD_001a8fb9_default;
  case 0x1b:
    printi512mem(MI,1,O);
    break;
  case 0x1c:
    printf256mem(MI,1,O);
    break;
  case 0x1d:
    printf512mem(MI,1,O);
    break;
  case 0x1e:
    printi64mem(MI,3,O);
    goto LAB_001a9ae9;
  case 0x1f:
    printOperand(MI,3,O);
    SStream_concat0(O,"}, ");
    break;
  case 0x20:
    printi32mem(MI,3,O);
LAB_001a9ae9:
    SStream_concat0(O,", ");
    goto LAB_001a9afb;
  case 0x21:
    uVar5 = 2;
    goto LAB_001a9a89;
  default:
    uVar14 = 5;
LAB_001a9b29:
    printOperand(MI,uVar14,O);
  }
  switch((uint)(CONCAT44(uVar7,uVar5) >> 0x1f) & 0xf) {
  case 1:
    pcVar12 = ", ";
    break;
  default:
    goto switchD_001a8fb9_default;
  case 3:
switchD_001a95e9_caseD_d:
    SStream_concat0(O,", cl");
    reg_00 = 10;
LAB_001a9b81:
    op_addReg(MI,reg_00);
    goto switchD_001a8fb9_default;
  case 4:
    pcVar12 = "}, ";
    break;
  case 5:
    SStream_concat0(O,"} {z}, ");
    op_addAvxZeroOpmask(MI);
    pSVar11 = extraout_RDX_04;
    goto LAB_001a9bbd;
  case 6:
    goto switchD_001a9b5d_caseD_6;
  case 7:
    SStream_concat0(O,"qword ptr ");
    MI->x86opsize = '\b';
    goto LAB_001a9c45;
  case 8:
    MI->x86opsize = '\x04';
    SStream_concat0(O,"dword ptr ");
LAB_001a9c45:
    uVar5 = 4;
LAB_001a9c4a:
    printMemReference(MI,uVar5,O);
    goto switchD_001a8fb9_default;
  case 9:
    goto switchD_001a9b5d_caseD_9;
  case 10:
    goto switchD_001a9b5d_caseD_a;
  }
  SStream_concat0(O,pcVar12);
  pSVar11 = extraout_RDX_03;
LAB_001a9bbd:
  switch(uVar7 >> 3 & 0x1f) {
  case 1:
    printOperand(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
switchD_001a9b5d_caseD_6:
      SStream_concat0(O,", {sae}");
      op_addAvxSae(MI);
      break;
    }
  case 2:
    printi32mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 3:
    printi64mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 4:
    goto switchD_001a9be0_caseD_4;
  case 5:
    printOperand(MI,3,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 6:
    printf64mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 7:
    printf32mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 8:
    printf256mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 9:
    printf512mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 10:
    printf128mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 0xb:
    printi128mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 0xc:
    printi512mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 0xd:
    printi256mem(MI,2,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 0xe:
    printRoundingControl(MI,(uint)O,pSVar11);
    break;
  case 0xf:
LAB_001a9d53:
    printf512mem(MI,3,O);
    break;
  case 0x10:
    printf64mem(MI,3,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 0x11:
    printf32mem(MI,3,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  case 0x12:
    printf128mem(MI,3,O);
    break;
  case 0x13:
    printf256mem(MI,3,O);
    break;
  case 0x14:
LAB_001aa004:
    printi128mem(MI,3,O);
    break;
  case 0x15:
LAB_001a9ef6:
    printi256mem(MI,3,O);
    break;
  case 0x16:
    uVar5 = 3;
LAB_001a9a89:
    printi512mem(MI,uVar5,O);
    break;
  case 0x17:
    printi32mem(MI,3,O);
    SStream_concat0(O,"{1to16}");
    goto LAB_001aa240;
  case 0x18:
    printi64mem(MI,3,O);
    SStream_concat0(O,"{1to8}");
    goto LAB_001aa225;
  case 0x19:
    printi8mem(MI,2,O);
    goto LAB_001a9e27;
  case 0x1a:
    printi16mem(MI,2,O);
LAB_001a9e27:
    SStream_concat0(O,", ");
switchD_001a9be0_caseD_4:
LAB_001a958f:
    uVar5 = 7;
    goto LAB_001a9b00;
  default:
    printOperand(MI,6,O);
    switch(uVar7 >> 8 & 7) {
    default:
      break;
    case 1:
      goto switchD_001aa063_caseD_1;
    case 2:
      goto switchD_001a9b5d_caseD_a;
    case 3:
      goto switchD_001a9b5d_caseD_9;
    case 4:
      goto switchD_001aa063_caseD_4;
    case 5:
      goto switchD_001aa063_caseD_5;
    case 6:
      goto switchD_001a9b5d_caseD_6;
    }
  }
  goto switchD_001a8fb9_default;
switchD_001aa063_caseD_1:
  SStream_concat0(O,", ");
  switch(uVar7 >> 0xb & 0xf) {
  case 0:
    uVar5 = 4;
    goto LAB_001aa172;
  case 1:
    uVar5 = 7;
    goto LAB_001aa172;
  case 2:
    printf64mem(MI,3,O);
    break;
  case 3:
    goto LAB_001a9d53;
  case 4:
    uVar5 = 3;
LAB_001aa172:
    printOperand(MI,uVar5,O);
    break;
  case 5:
    printf32mem(MI,3,O);
    break;
  case 6:
    printf128mem(MI,3,O);
    break;
  case 7:
    printf256mem(MI,3,O);
    break;
  case 8:
    printi32mem(MI,4,O);
    SStream_concat0(O,"{1to16}");
    goto LAB_001aa240;
  case 9:
    printi32mem(MI,3,O);
    break;
  case 10:
    uVar5 = 4;
    goto LAB_001a9a89;
  case 0xb:
    printi512mem(MI,3,O);
    break;
  case 0xc:
    printi64mem(MI,4,O);
    SStream_concat0(O,"{1to8}");
    goto LAB_001aa225;
  case 0xd:
    printi64mem(MI,3,O);
    break;
  case 0xe:
    goto LAB_001aa004;
  case 0xf:
    goto LAB_001a9ef6;
  }
  switch(uVar7 >> 0xf & 7) {
  case 1:
    SStream_concat0(O,", ");
    uVar5 = uVar7 >> 0x12 & 3;
    if (uVar5 == 1) {
      uVar5 = 5;
    }
    else if (uVar5 == 2) {
      uVar5 = 4;
    }
    else {
LAB_001a9afb:
      uVar5 = 8;
    }
LAB_001a9b00:
    printOperand(MI,uVar5,O);
    goto switchD_001a8fb9_default;
  case 2:
    goto switchD_001a9b5d_caseD_a;
  case 3:
switchD_001a9b5d_caseD_9:
    SStream_concat0(O,"{1to16}");
LAB_001aa240:
    v = X86_AVX_BCAST_16;
    break;
  case 4:
switchD_001aa063_caseD_4:
    SStream_concat0(O,"{1to4}");
    v = X86_AVX_BCAST_4;
    break;
  case 5:
switchD_001aa063_caseD_5:
    SStream_concat0(O,"{1to2}");
    v = X86_AVX_BCAST_2;
    break;
  default:
    goto switchD_001a8fb9_default;
  }
  goto LAB_001aa245;
switchD_001a9b5d_caseD_a:
  SStream_concat0(O,"{1to8}");
LAB_001aa225:
  v = X86_AVX_BCAST_8;
LAB_001aa245:
  op_addAvxBroadcast(MI,v);
switchD_001a8fb9_default:
  uVar5 = MCInst_getOpcode(MI);
  xVar6 = X86_insn_reg_intel(uVar5);
  local_38 = xVar6;
  if (MI->csh->detail != CS_OPT_OFF) {
    if (xVar6 == X86_REG_INVALID) {
      uVar5 = MCInst_getOpcode(MI);
      _Var4 = X86_insn_reg_intel2(uVar5,&local_38,&local_34);
      if (_Var4) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = local_38;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[local_38];
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = local_34;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x80) = MI->csh->regsize_map[local_34];
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar3 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar3->field_6 + 0x60),(void *)((long)&pcVar3->field_6 + 0x30),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar6;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x50) = MI->csh->regsize_map[xVar6];
      puVar15 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar15 = *puVar15 + '\x01';
    }
  }
  if (local_38 != X86_REG_INVALID && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[local_38];
  }
  return;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
	char *mnem;
	x86_reg reg, reg2;

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI));
	if (MI->csh->detail) {
		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &reg2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}